

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Gemm_x86::forward
          (Gemm_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  pointer pMVar1;
  Mat *this_00;
  size_t sVar2;
  void *pvVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  Mat *pMVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  int *piVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  Mat *pMVar24;
  uint uVar25;
  Mat *pMVar26;
  size_t sVar27;
  int iVar28;
  bool bVar29;
  int iVar30;
  uint uVar31;
  int iVar32;
  int iVar33;
  int TILE_N;
  int TILE_M;
  ulong local_1e8;
  ulong local_1e0;
  Mat local_1d8;
  ulong local_188;
  Mat *local_180;
  Mat *local_178;
  ulong local_170;
  ulong local_168;
  Mat *local_160;
  Mat local_158;
  ulong local_108;
  int local_100;
  int TILE_K;
  Mat local_f8;
  long local_a8;
  ulong local_a0;
  uint local_94;
  ulong local_90;
  int TILE_M_2;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  int local_70;
  Allocator *local_68;
  int iStack_60;
  uint uStack_5c;
  int iStack_58;
  undefined8 uStack_54;
  ulong local_48;
  ulong local_38;
  
  if ((this->super_Gemm).int8_scale_term != 0) {
    iVar8 = forward_int8(this,bottom_blobs,top_blobs,opt);
    return iVar8;
  }
  iVar8 = (this->super_Gemm).constantA;
  iVar11 = (this->super_Gemm).constantB;
  if (iVar11 != 0 && iVar8 != 0) {
    uVar9 = (this->super_Gemm).constantM;
LAB_0047b70c:
    uVar25 = (this->super_Gemm).constantN;
  }
  else {
    pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar8 == 0) {
      iVar30 = (this->super_Gemm).transA;
      if (iVar11 != 0) {
        if (iVar30 == 0) {
          uVar9 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
        }
        else {
          uVar9 = pMVar1->w;
        }
        goto LAB_0047b70c;
      }
      if (iVar30 == 0) {
        uVar9 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
      }
      else {
        uVar9 = pMVar1->w;
      }
      if ((this->super_Gemm).transB == 0) {
        uVar25 = pMVar1[1].w;
      }
      else {
        uVar25 = pMVar1[1].elempack * (&pMVar1[1].h)[(ulong)(pMVar1[1].dims == 3) * 2];
      }
    }
    else {
      uVar9 = (this->super_Gemm).constantM;
      if ((this->super_Gemm).transB == 0) {
        uVar25 = pMVar1->w;
      }
      else {
        uVar25 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
      }
    }
  }
  local_1d8.cstep = 0;
  iVar30 = 0;
  uVar31 = 0;
  iVar32 = 0;
  iVar33 = 0;
  local_1d8.data = (void *)0x0;
  local_1d8.refcount._0_4_ = 0;
  local_1d8.refcount._4_4_ = 0;
  local_1d8.elemsize._0_4_ = 0;
  local_1d8.elemsize._4_4_ = 0;
  local_1d8.elempack = 0;
  local_1d8.allocator = (Allocator *)0x0;
  local_1d8.dims = 0;
  local_1d8.w = 0;
  local_1d8.h = 0;
  local_1d8.d = 0;
  local_1d8.c = 0;
  if ((this->super_Gemm).constantC == 0) {
    pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar20 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar1;
    if (iVar11 != 0 && iVar8 != 0) {
      bVar29 = true;
      if (lVar20 == 0x48) {
        local_1d8.data = pMVar1->data;
        piVar19 = pMVar1->refcount;
        sVar27 = pMVar1->elemsize;
        local_1d8.elempack = pMVar1->elempack;
        local_1d8.allocator = pMVar1->allocator;
        iVar30 = pMVar1->dims;
        uVar31 = pMVar1->w;
        iVar32 = pMVar1->h;
        iVar33 = pMVar1->d;
        local_1d8.c = pMVar1->c;
        local_1d8.cstep = pMVar1->cstep;
        if (piVar19 == (int *)0x0) {
          piVar19 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar19 = *piVar19 + 1;
          UNLOCK();
          LOCK();
          *piVar19 = *piVar19 + 1;
          UNLOCK();
          bVar29 = false;
        }
      }
      else {
        local_1d8.allocator = (Allocator *)0x0;
        local_1d8.elempack = 0;
        sVar27 = 0;
        piVar19 = (int *)0x0;
        local_1d8.data = (void *)0x0;
        local_1d8.c = 0;
        local_1d8.cstep = 0;
      }
      local_1d8.refcount._0_4_ = SUB84(piVar19,0);
      local_1d8.refcount._4_4_ = (undefined4)((ulong)piVar19 >> 0x20);
      local_1d8.elemsize._0_4_ = (undefined4)sVar27;
      local_1d8.elemsize._4_4_ = (undefined4)(sVar27 >> 0x20);
      local_1d8.dims = iVar30;
      local_1d8.w = uVar31;
      local_1d8.h = iVar32;
      local_1d8.d = iVar33;
      if (!bVar29) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 == 0) {
          if (local_1d8.allocator == (Allocator *)0x0) goto LAB_0047d485;
          (*(local_1d8.allocator)->_vptr_Allocator[3])(local_1d8.allocator,local_1d8.data);
        }
      }
    }
    else if (iVar8 == 0) {
      if (iVar11 == 0) {
        bVar29 = true;
        if (lVar20 == 0xd8) {
          local_1d8.data = pMVar1[2].data;
          piVar19 = pMVar1[2].refcount;
          sVar27 = pMVar1[2].elemsize;
          local_1d8.elempack = pMVar1[2].elempack;
          local_1d8.allocator = pMVar1[2].allocator;
          iVar30 = pMVar1[2].dims;
          uVar31 = pMVar1[2].w;
          iVar32 = pMVar1[2].h;
          iVar33 = pMVar1[2].d;
          local_1d8.c = pMVar1[2].c;
          local_1d8.cstep = pMVar1[2].cstep;
          if (piVar19 == (int *)0x0) {
            piVar19 = (int *)0x0;
          }
          else {
            LOCK();
            *piVar19 = *piVar19 + 1;
            UNLOCK();
            LOCK();
            *piVar19 = *piVar19 + 1;
            UNLOCK();
            bVar29 = false;
          }
        }
        else {
          local_1d8.cstep = 0;
          local_1d8.c = 0;
          local_1d8.allocator = (Allocator *)0x0;
          local_1d8.elempack = 0;
          sVar27 = 0;
          piVar19 = (int *)0x0;
          local_1d8.data = (void *)0x0;
        }
        local_1d8.refcount._0_4_ = SUB84(piVar19,0);
        local_1d8.refcount._4_4_ = (undefined4)((ulong)piVar19 >> 0x20);
        local_1d8.elemsize._0_4_ = (undefined4)sVar27;
        local_1d8.elemsize._4_4_ = (undefined4)(sVar27 >> 0x20);
        local_1d8.dims = iVar30;
        local_1d8.w = uVar31;
        local_1d8.h = iVar32;
        local_1d8.d = iVar33;
        if (!bVar29) {
          LOCK();
          *piVar19 = *piVar19 + -1;
          UNLOCK();
          if (*piVar19 == 0) {
            if (local_1d8.allocator == (Allocator *)0x0) goto LAB_0047d485;
            (*(local_1d8.allocator)->_vptr_Allocator[3])(local_1d8.allocator,local_1d8.data);
          }
        }
      }
      else {
        bVar29 = true;
        if (lVar20 == 0x90) {
          local_1d8.data = pMVar1[1].data;
          piVar19 = pMVar1[1].refcount;
          sVar27 = pMVar1[1].elemsize;
          local_1d8.elempack = pMVar1[1].elempack;
          local_1d8.allocator = pMVar1[1].allocator;
          iVar30 = pMVar1[1].dims;
          uVar31 = pMVar1[1].w;
          iVar32 = pMVar1[1].h;
          iVar33 = pMVar1[1].d;
          local_1d8.c = pMVar1[1].c;
          local_1d8.cstep = pMVar1[1].cstep;
          if (piVar19 == (int *)0x0) {
            piVar19 = (int *)0x0;
          }
          else {
            LOCK();
            *piVar19 = *piVar19 + 1;
            UNLOCK();
            LOCK();
            *piVar19 = *piVar19 + 1;
            UNLOCK();
            bVar29 = false;
          }
        }
        else {
          local_1d8.cstep = 0;
          local_1d8.c = 0;
          local_1d8.allocator = (Allocator *)0x0;
          local_1d8.elempack = 0;
          sVar27 = 0;
          piVar19 = (int *)0x0;
          local_1d8.data = (void *)0x0;
        }
        local_1d8.refcount._0_4_ = SUB84(piVar19,0);
        local_1d8.refcount._4_4_ = (undefined4)((ulong)piVar19 >> 0x20);
        local_1d8.elemsize._0_4_ = (undefined4)sVar27;
        local_1d8.elemsize._4_4_ = (undefined4)(sVar27 >> 0x20);
        local_1d8.dims = iVar30;
        local_1d8.w = uVar31;
        local_1d8.h = iVar32;
        local_1d8.d = iVar33;
        if (!bVar29) {
          LOCK();
          *piVar19 = *piVar19 + -1;
          UNLOCK();
          if (*piVar19 == 0) {
            if (local_1d8.allocator == (Allocator *)0x0) {
LAB_0047d485:
              if (local_1d8.data != (void *)0x0) {
                free(local_1d8.data);
              }
            }
            else {
              (*(local_1d8.allocator)->_vptr_Allocator[3])(local_1d8.allocator,local_1d8.data);
            }
          }
        }
      }
    }
    else {
      bVar29 = true;
      if (lVar20 == 0x90) {
        local_1d8.data = pMVar1[1].data;
        piVar19 = pMVar1[1].refcount;
        sVar27 = pMVar1[1].elemsize;
        local_1d8.elempack = pMVar1[1].elempack;
        local_1d8.allocator = pMVar1[1].allocator;
        iVar30 = pMVar1[1].dims;
        uVar31 = pMVar1[1].w;
        iVar32 = pMVar1[1].h;
        iVar33 = pMVar1[1].d;
        local_1d8.c = pMVar1[1].c;
        local_1d8.cstep = pMVar1[1].cstep;
        if (piVar19 == (int *)0x0) {
          piVar19 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar19 = *piVar19 + 1;
          UNLOCK();
          LOCK();
          *piVar19 = *piVar19 + 1;
          UNLOCK();
          bVar29 = false;
        }
      }
      else {
        local_1d8.cstep = 0;
        local_1d8.c = 0;
        local_1d8.allocator = (Allocator *)0x0;
        local_1d8.elempack = 0;
        sVar27 = 0;
        piVar19 = (int *)0x0;
        local_1d8.data = (void *)0x0;
      }
      local_1d8.refcount._0_4_ = SUB84(piVar19,0);
      local_1d8.refcount._4_4_ = (undefined4)((ulong)piVar19 >> 0x20);
      local_1d8.elemsize._0_4_ = (undefined4)sVar27;
      local_1d8.elemsize._4_4_ = (undefined4)(sVar27 >> 0x20);
      local_1d8.dims = iVar30;
      local_1d8.w = uVar31;
      local_1d8.h = iVar32;
      local_1d8.d = iVar33;
      if (!bVar29) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 == 0) {
          if (local_1d8.allocator == (Allocator *)0x0) goto LAB_0047d485;
          (*(local_1d8.allocator)->_vptr_Allocator[3])(local_1d8.allocator,local_1d8.data);
        }
      }
    }
    uVar31 = 0;
    if ((local_1d8.data != (void *)0x0) && ((long)local_1d8.c * local_1d8.cstep != 0)) {
      if (local_1d8.dims == 1) {
        uVar31 = 4;
        if (local_1d8.w * local_1d8.elempack != uVar25) {
          uVar31 = (uint)(local_1d8.w * local_1d8.elempack == uVar9);
        }
      }
      else {
        bVar29 = local_1d8.dims == 2;
        uVar31 = 0;
        if (local_1d8.w == 1U && bVar29) {
          uVar31 = (uint)(local_1d8.elempack * local_1d8.h == uVar9) * 2;
        }
        if ((local_1d8.w == 1U && bVar29 || bVar29) && (local_1d8.w == uVar25)) {
          if (local_1d8.elempack * local_1d8.h == uVar9) {
            uVar31 = 3;
          }
          if (local_1d8.elempack * local_1d8.h == 1) {
            uVar31 = 4;
          }
        }
      }
      if ((this->super_Gemm).beta != 1.0) {
        local_158.cstep = 0;
        local_158.data = (void *)0x0;
        local_158.refcount._0_4_ = 0;
        local_158.refcount._4_4_ = 0;
        local_158.elemsize._0_4_ = 0;
        local_158.elemsize._4_4_ = 0;
        local_158.elempack = 0;
        local_158.allocator = (Allocator *)0x0;
        local_158.dims = 0;
        local_158.w = 0;
        local_158.h = 0;
        local_158.d = 0;
        local_158.c = 0;
        Mat::create_like(&local_158,&local_1d8,opt->workspace_allocator);
        uVar16 = local_1d8.c * (int)local_1d8.cstep * local_1d8.elempack;
        if (0 < (int)uVar16) {
          uVar18 = 0;
          do {
            *(float *)((long)local_158.data + uVar18 * 4) =
                 (this->super_Gemm).beta * *(float *)((long)local_1d8.data + uVar18 * 4);
            uVar18 = uVar18 + 1;
          } while (uVar16 != uVar18);
        }
        piVar19 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
        if (piVar19 != (int *)0x0) {
          LOCK();
          *piVar19 = *piVar19 + 1;
          UNLOCK();
        }
        piVar19 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        if (piVar19 != (int *)0x0) {
          LOCK();
          *piVar19 = *piVar19 + -1;
          UNLOCK();
          if (*piVar19 == 0) {
            if (local_1d8.allocator == (Allocator *)0x0) {
              if (local_1d8.data != (void *)0x0) {
                free(local_1d8.data);
              }
            }
            else {
              (*(local_1d8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_1d8.data = local_158.data;
        piVar19 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
        local_1d8.refcount._0_4_ = local_158.refcount._0_4_;
        local_1d8.refcount._4_4_ = local_158.refcount._4_4_;
        local_1d8.elemsize._0_4_ = (undefined4)local_158.elemsize;
        local_1d8.elemsize._4_4_ = local_158.elemsize._4_4_;
        local_1d8.elempack = local_158.elempack;
        local_1d8.allocator = local_158.allocator;
        local_1d8.dims = local_158.dims;
        local_1d8.w = local_158.w;
        local_1d8.h = local_158.h;
        local_1d8.d = local_158.d;
        local_1d8.c = local_158.c;
        local_1d8.cstep = local_158.cstep;
        if (piVar19 != (int *)0x0) {
          LOCK();
          *piVar19 = *piVar19 + -1;
          UNLOCK();
          if (*piVar19 == 0) {
            if (local_158.allocator == (Allocator *)0x0) {
              if (local_158.data != (void *)0x0) {
                free(local_158.data);
              }
            }
            else {
              (*(local_158.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
    }
  }
  else {
    if (&local_1d8 != &this->CT_data) {
      piVar19 = (this->CT_data).refcount;
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + 1;
        UNLOCK();
      }
      local_1d8.data = (this->CT_data).data;
      piVar19 = (this->CT_data).refcount;
      local_1d8.refcount._0_4_ = SUB84(piVar19,0);
      local_1d8.refcount._4_4_ = (undefined4)((ulong)piVar19 >> 0x20);
      sVar27 = (this->CT_data).elemsize;
      local_1d8.elemsize._0_4_ = (undefined4)sVar27;
      local_1d8.elemsize._4_4_ = (undefined4)(sVar27 >> 0x20);
      local_1d8.elempack = (this->CT_data).elempack;
      local_1d8.allocator = (this->CT_data).allocator;
      uVar4 = (this->CT_data).dims;
      uVar5 = (this->CT_data).w;
      uVar6 = (this->CT_data).h;
      uVar7 = (this->CT_data).d;
      local_1d8.c = (this->CT_data).c;
      local_1d8.cstep = (this->CT_data).cstep;
      local_1d8.dims = uVar4;
      local_1d8.w = uVar5;
      local_1d8.h = uVar6;
      local_1d8.d = uVar7;
    }
    uVar31 = (this->super_Gemm).constant_broadcast_type_C;
  }
  iVar8 = (this->super_Gemm).output_transpose;
  uVar16 = 1;
  if (opt->use_packing_layout == true) {
    uVar16 = uVar25;
    if (iVar8 == 0) {
      uVar16 = uVar9;
    }
    uVar16 = (uint)((uVar16 & 3) == 0) * 3 + 1;
  }
  uVar23 = (this->super_Gemm).output_elempack;
  if (uVar23 != 0) {
    uVar16 = uVar23;
  }
  uVar18 = (ulong)uVar16;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar23 = uVar25;
  if (iVar8 != 0) {
    uVar23 = uVar9;
    uVar9 = uVar25;
  }
  if ((this->super_Gemm).output_N1M == 0) {
    Mat::create(this_00,uVar23,(int)uVar9 / (int)uVar16,(ulong)(uVar16 * 4),uVar16,
                opt->blob_allocator);
  }
  else {
    Mat::create(this_00,uVar23,1,(int)uVar9 / (int)uVar16,(ulong)(uVar16 * 4),uVar16,
                opt->blob_allocator);
  }
  iVar8 = -100;
  if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0)) goto LAB_0047d279;
  iVar8 = *(int *)&(this->super_Gemm).field_0x244;
  iVar11 = iVar8;
  if (iVar8 == 0) {
    iVar11 = opt->num_threads;
  }
  if (opt->num_threads != iVar8 && iVar8 != 0) {
    forward();
  }
  iVar8 = (this->super_Gemm).constantA;
  iVar30 = (this->super_Gemm).constantB;
  local_90 = uVar18;
  if (iVar30 == 0 || iVar8 == 0) {
    pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (iVar8 == 0) {
      if (iVar30 == 0) {
        iVar8 = gemm_x86(pMVar24,pMVar24 + 1,&local_1d8,this_00,uVar31,(this->super_Gemm).transA,
                         (this->super_Gemm).transB,(this->super_Gemm).output_transpose,
                         (this->super_Gemm).constant_TILE_M,(this->super_Gemm).constant_TILE_N,
                         (this->super_Gemm).constant_TILE_K,iVar11,opt);
        iVar11 = (int)local_90;
        goto LAB_0047d274;
      }
      iVar8 = (this->super_Gemm).transA;
      iVar30 = (this->super_Gemm).constantN;
      iVar32 = (this->super_Gemm).constantK;
      local_108 = CONCAT44(local_108._4_4_,iVar8);
      if (iVar8 == 0) {
        iVar8 = pMVar24->elempack * (&pMVar24->h)[(ulong)(pMVar24->dims == 3) * 2];
      }
      else {
        iVar8 = pMVar24->w;
      }
      local_170 = CONCAT44(local_170._4_4_,(this->super_Gemm).output_transpose);
      get_optimal_tile_mnk
                (iVar8,iVar30,iVar32,(this->super_Gemm).constant_TILE_M,
                 (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,&TILE_M,
                 &TILE_N,&TILE_K,iVar11);
      local_38 = (ulong)(uint)TILE_M;
      local_94 = (iVar8 + TILE_M + -1) / TILE_M;
      local_1e8 = (ulong)(uint)TILE_K;
      local_158.cstep = 0;
      local_158.data = (void *)0x0;
      local_158.refcount._0_4_ = 0;
      local_158.refcount._4_4_ = 0;
      local_158.elemsize._0_4_ = 0;
      local_158.elemsize._4_4_ = 0;
      local_158.elempack = 0;
      local_158.allocator = (Allocator *)0x0;
      local_158.dims = 0;
      local_158.w = 0;
      local_158.h = 0;
      local_158.d = 0;
      local_158.c = 0;
      Mat::create(&local_158,TILE_K * TILE_M,(iVar32 + TILE_K + -1) / TILE_K,iVar11,4,
                  opt->workspace_allocator);
      iVar8 = -100;
      if ((local_158.data != (void *)0x0) && ((long)local_158.c * local_158.cstep != 0)) {
        local_f8.cstep = 0;
        local_f8.data = (Mat *)0x0;
        local_f8.refcount._0_4_ = 0;
        local_f8.refcount._4_4_ = 0;
        local_f8.elemsize._0_4_ = 0;
        local_f8.elemsize._4_4_ = 0;
        local_f8.elempack = 0;
        local_f8.allocator = (Allocator *)0x0;
        local_f8.dims = 0;
        local_f8.w = 0;
        local_f8.h = 0;
        local_f8.d = 0;
        local_f8.c = 0;
        if (((int)local_170 == 0) && ((uVar31 != 3 && (iVar32 <= (int)local_1e8)))) {
LAB_0047cb5c:
          if (0 < (int)local_94) {
            local_a8 = CONCAT71(local_a8._1_7_,(int)local_170 == 0);
            local_a0 = 0;
            uVar18 = (ulong)(uint)TILE_N;
            local_160 = (Mat *)CONCAT44(local_160._4_4_,TILE_N);
            local_100 = iVar30;
            do {
              if ((int)local_108 == 0) {
                iVar8 = pMVar24->elempack * (&pMVar24->h)[(ulong)(pMVar24->dims == 3) * 2];
                iVar11 = pMVar24->w;
              }
              else {
                iVar8 = pMVar24->w;
                iVar11 = pMVar24->elempack * (&pMVar24->h)[(ulong)(pMVar24->dims == 3) * 2];
              }
              iVar33 = (int)local_38;
              iVar14 = iVar33 * (int)local_a0;
              iVar32 = iVar8 - iVar14;
              if (iVar33 < iVar8 - iVar14) {
                iVar32 = iVar33;
              }
              local_48 = 0;
              _TILE_M_2 = (Mat *)0x0;
              uStack_80 = 0;
              uStack_7c = 0;
              local_78 = 0;
              uStack_74 = 0;
              local_70 = 0;
              iStack_58 = 0;
              uStack_54._0_4_ = 0;
              uStack_54._4_4_ = 0;
              local_68 = (Allocator *)0x0;
              iStack_60 = 0;
              uStack_5c = 0;
              if ((((int)local_170 != 0) || (uVar31 == 3)) || ((int)local_1e8 < iVar11)) {
                iVar8 = get_omp_thread_num();
                uVar12 = CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize);
                local_48 = ((long)local_f8.w * (long)local_f8.h * uVar12 + 0xf & 0xfffffffffffffff0)
                           / uVar12;
                if (local_f8.dims == 4) {
                  local_48 = (long)local_f8.w * (long)local_f8.h;
                }
                iStack_60 = local_f8.dims + -1;
                _TILE_M_2 = (Mat *)((long)(void **)local_f8.data +
                                   (long)iVar8 * uVar12 * local_f8.cstep);
                local_78 = (undefined4)local_f8.elemsize;
                uStack_74 = local_f8.elemsize._4_4_;
                local_70 = local_f8.elempack;
                local_68 = local_f8.allocator;
                uStack_5c = local_f8.w;
                iStack_58 = local_f8.h;
                uStack_54._4_4_ = local_f8.d;
                uStack_54._0_4_ = 1;
              }
              uStack_7c = 0;
              uStack_80 = 0;
              local_180 = _TILE_M_2;
              if (0 < iVar30) {
                iVar8 = 0;
                do {
                  local_188 = (ulong)(uint)(iVar30 - iVar8);
                  if ((int)uVar18 < iVar30 - iVar8) {
                    local_188 = uVar18;
                  }
                  local_178 = &local_1d8;
                  if (uVar31 == 3) {
                    pack_A_tile(&local_1d8,local_180,iVar14,iVar32,iVar8,(int)local_188);
                    local_178 = (Mat *)&TILE_M_2;
                  }
                  if (0 < iVar11) {
                    uVar18 = local_1e8;
                    iVar30 = iVar11;
                    iVar33 = 0;
                    do {
                      iVar17 = (int)uVar18;
                      iVar10 = iVar30;
                      if (iVar17 < iVar30) {
                        iVar10 = iVar17;
                      }
                      iVar22 = get_omp_thread_num();
                      uVar21 = (ulong)(iVar33 / iVar17);
                      pMVar15 = (Mat *)((long)local_158.data +
                                       (long)local_158.w *
                                       CONCAT44(local_158.elemsize._4_4_,
                                                (undefined4)local_158.elemsize) * uVar21 +
                                       (long)iVar22 * local_158.cstep *
                                       CONCAT44(local_158.elemsize._4_4_,
                                                (undefined4)local_158.elemsize));
                      iVar22 = iVar8 / (int)local_160;
                      iVar17 = (this->BT_data).w;
                      sVar27 = (this->BT_data).cstep;
                      uVar12 = (this->BT_data).elemsize;
                      pvVar3 = (this->BT_data).data;
                      uVar13 = uVar12;
                      if (iVar8 == 0) {
                        local_1e0 = uVar21;
                        local_168 = uVar12;
                        if ((int)local_108 == 0) {
                          pack_A_tile(pMVar24,pMVar15,iVar14,iVar32,iVar33,iVar10);
                          uVar13 = local_168;
                          uVar18 = local_1e8;
                          uVar21 = local_1e0;
                        }
                        else {
                          transpose_pack_A_tile(pMVar24,pMVar15,iVar14,iVar32,iVar33,iVar10);
                          uVar13 = local_168;
                          uVar18 = local_1e8;
                          uVar21 = local_1e0;
                        }
                      }
                      iVar28 = iVar33 + (int)uVar18;
                      gemm_transB_packed_tile
                                (pMVar15,(Mat *)((long)pvVar3 +
                                                (long)iVar17 * uVar13 * uVar21 +
                                                (long)iVar22 * sVar27 * uVar12),local_178,local_180,
                                 this_00,uVar31,iVar14,iVar32,iVar8,(int)local_188,iVar33,iVar10,
                                 (bool)(iVar11 <= iVar28 & (byte)local_a8));
                      iVar30 = iVar30 - (int)uVar18;
                      iVar33 = iVar28;
                    } while (iVar28 < iVar11);
                  }
                  if ((int)local_170 != 0) {
                    transpose_unpack_output_tile
                              (local_180,this_00,iVar14,iVar32,iVar8,(int)local_188);
                  }
                  uVar18 = (ulong)local_160 & 0xffffffff;
                  iVar8 = iVar8 + (int)local_160;
                  iVar30 = local_100;
                } while (iVar8 < local_100);
              }
              uVar9 = (int)local_a0 + 1;
              local_a0 = (ulong)uVar9;
            } while (uVar9 != local_94);
          }
          iVar8 = 0;
        }
        else {
          Mat::create(&local_f8,TILE_N * (int)local_38,1,iVar11,4,opt->workspace_allocator);
          iVar8 = -100;
          if (((Mat *)local_f8.data != (Mat *)0x0) && ((long)local_f8.c * local_f8.cstep != 0))
          goto LAB_0047cb5c;
        }
        piVar19 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
        if (piVar19 != (int *)0x0) {
          LOCK();
          *piVar19 = *piVar19 + -1;
          UNLOCK();
          if (*piVar19 == 0) {
            if (local_f8.allocator == (Allocator *)0x0) {
              if ((Mat *)local_f8.data != (Mat *)0x0) {
                free(local_f8.data);
              }
            }
            else {
              (*(local_f8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      piVar19 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
      iVar11 = (int)local_90;
      if (piVar19 == (int *)0x0) goto LAB_0047d274;
      LOCK();
      *piVar19 = *piVar19 + -1;
      UNLOCK();
      if (*piVar19 != 0) goto LAB_0047d274;
      if (local_158.allocator != (Allocator *)0x0) {
        (*(local_158.allocator)->_vptr_Allocator[3])();
        goto LAB_0047d274;
      }
      if (local_158.data == (void *)0x0) goto LAB_0047d274;
LAB_0047d26c:
      free(local_158.data);
    }
    else {
      iVar30 = (this->super_Gemm).transB;
      uVar9 = (this->super_Gemm).constantM;
      uVar18 = (ulong)uVar9;
      uVar25 = (this->super_Gemm).constantK;
      if (iVar30 == 0) {
        uVar16 = pMVar24->w;
      }
      else {
        uVar16 = pMVar24->elempack * (&pMVar24->h)[(ulong)(pMVar24->dims == 3) * 2];
      }
      local_1e8 = CONCAT44(local_1e8._4_4_,(this->super_Gemm).output_transpose);
      get_optimal_tile_mnk
                (uVar9,uVar16,uVar25,(this->super_Gemm).constant_TILE_M,
                 (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,&TILE_M,
                 &TILE_N,&TILE_K,iVar11);
      local_108 = (ulong)(uint)TILE_M;
      uVar9 = (int)(TILE_M + uVar9 + -1) / TILE_M;
      local_1e0 = (ulong)(uint)TILE_N;
      iVar32 = (int)(uVar16 + TILE_N + -1) / TILE_N;
      local_178 = (Mat *)(ulong)(uint)TILE_K;
      iVar33 = (int)(uVar25 + TILE_K + -1) / TILE_K;
      local_158.cstep = 0;
      local_158.data = (void *)0x0;
      local_158.refcount._0_4_ = 0;
      local_158.refcount._4_4_ = 0;
      local_158.elemsize._0_4_ = 0;
      local_158.elemsize._4_4_ = 0;
      local_158.elempack = 0;
      local_158.allocator = (Allocator *)0x0;
      local_158.dims = 0;
      local_158.w = 0;
      local_158.h = 0;
      local_158.d = 0;
      local_158.c = 0;
      local_168 = (ulong)uVar16;
      Mat::create(&local_158,TILE_K * TILE_N,iVar33,iVar32,4,opt->workspace_allocator);
      iVar8 = -100;
      local_170 = uVar18;
      if ((local_158.data != (void *)0x0) && ((long)local_158.c * local_158.cstep != 0)) {
        iVar32 = iVar32 * iVar33;
        if (0 < iVar32) {
          iVar8 = 0;
          do {
            iVar17 = (int)local_1e0;
            iVar10 = (iVar8 / iVar33) * iVar17;
            iVar28 = (int)local_178;
            iVar22 = (int)((long)iVar8 % (long)iVar33) * iVar28;
            iVar14 = (int)local_168 - iVar10;
            if (iVar17 < iVar14) {
              iVar14 = iVar17;
            }
            iVar17 = uVar25 - iVar22;
            if (iVar28 < (int)(uVar25 - iVar22)) {
              iVar17 = iVar28;
            }
            pMVar15 = (Mat *)((long)local_158.data +
                             ((long)iVar8 % (long)iVar33 & 0xffffffffU) * (long)local_158.w *
                             CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize) +
                             (long)(iVar8 / iVar33) * local_158.cstep *
                             CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize));
            if (iVar30 == 0) {
              transpose_pack_B_tile(pMVar24,pMVar15,iVar10,iVar14,iVar22,iVar17);
            }
            else {
              pack_B_tile(pMVar24,pMVar15,iVar10,iVar14,iVar22,iVar17);
            }
            iVar8 = iVar8 + 1;
          } while (iVar32 != iVar8);
        }
        uVar12 = local_168;
        uVar18 = local_1e0;
        local_f8.cstep = 0;
        local_100 = CONCAT31(local_100._1_3_,
                             (int)local_1e8 != 0 || (uVar31 == 3 || (int)local_178 < (int)uVar25));
        local_f8.data = (Mat *)0x0;
        local_f8.refcount._0_4_ = 0;
        local_f8.refcount._4_4_ = 0;
        local_f8.elemsize._0_4_ = 0;
        local_f8.elemsize._4_4_ = 0;
        local_f8.elempack = 0;
        local_f8.allocator = (Allocator *)0x0;
        local_f8.dims = 0;
        local_f8.w = 0;
        local_f8.h = 0;
        local_f8.d = 0;
        local_f8.c = 0;
        if ((int)local_1e8 != 0 || (uVar31 == 3 || (int)local_178 < (int)uVar25)) {
          Mat::create(&local_f8,(int)local_1e0 * (int)local_108,1,iVar11,4,opt->workspace_allocator)
          ;
          iVar8 = -100;
          if (((Mat *)local_f8.data != (Mat *)0x0) && ((long)local_f8.c * local_f8.cstep != 0))
          goto LAB_0047c44c;
        }
        else {
LAB_0047c44c:
          if (0 < (int)uVar9) {
            bVar29 = (int)local_1e8 == 0;
            local_a0 = (ulong)uVar9;
            uVar13 = 0;
            do {
              iVar11 = (int)local_108;
              uVar9 = iVar11 * (int)uVar13;
              pMVar24 = (Mat *)(ulong)uVar9;
              iVar8 = (int)local_170 - uVar9;
              if (iVar11 < iVar8) {
                iVar8 = iVar11;
              }
              local_48 = 0;
              _TILE_M_2 = (Mat *)0x0;
              uStack_80 = 0;
              uStack_7c = 0;
              local_78 = 0;
              uStack_74 = 0;
              local_70 = 0;
              iStack_58 = 0;
              uStack_54._0_4_ = 0;
              uStack_54._4_4_ = 0;
              local_68 = (Allocator *)0x0;
              iStack_60 = 0;
              uStack_5c = 0;
              local_188 = uVar13;
              if ((char)local_100 != '\0') {
                iVar11 = get_omp_thread_num();
                uVar13 = CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize);
                local_48 = ((long)local_f8.w * (long)local_f8.h * uVar13 + 0xf & 0xfffffffffffffff0)
                           / uVar13;
                if (local_f8.dims == 4) {
                  local_48 = (long)local_f8.w * (long)local_f8.h;
                }
                iStack_60 = local_f8.dims + -1;
                _TILE_M_2 = (Mat *)((long)(void **)local_f8.data +
                                   (long)iVar11 * uVar13 * local_f8.cstep);
                local_78 = (undefined4)local_f8.elemsize;
                uStack_74 = local_f8.elemsize._4_4_;
                local_70 = local_f8.elempack;
                local_68 = local_f8.allocator;
                uStack_5c = local_f8.w;
                iStack_58 = local_f8.h;
                uStack_54._4_4_ = local_f8.d;
                uStack_54._0_4_ = 1;
              }
              pMVar15 = _TILE_M_2;
              uStack_7c = 0;
              uStack_80 = 0;
              if (0 < (int)uVar12) {
                iVar11 = 0;
                local_180 = pMVar24;
                do {
                  iVar30 = (int)uVar12 - iVar11;
                  if ((int)uVar18 < iVar30) {
                    iVar30 = (int)uVar18;
                  }
                  pMVar26 = &local_1d8;
                  if (uVar31 == 3) {
                    pack_A_tile(&local_1d8,pMVar15,(int)pMVar24,iVar8,iVar11,iVar30);
                    pMVar26 = (Mat *)&TILE_M_2;
                  }
                  if (0 < (int)uVar25) {
                    local_a8 = (long)(iVar11 / (int)local_1e0);
                    local_160 = pMVar26;
                    uVar9 = uVar25;
                    iVar32 = 0;
                    do {
                      iVar33 = (int)local_178;
                      pMVar24 = (Mat *)(ulong)uVar9;
                      if (iVar33 < (int)uVar9) {
                        pMVar24 = local_178;
                      }
                      uVar9 = -(iVar33 - uVar9);
                      sVar27 = (this->AT_data).elemsize;
                      iVar14 = iVar32 + iVar33;
                      gemm_transB_packed_tile
                                ((Mat *)((long)(this->AT_data).data +
                                        (long)(this->AT_data).w * sVar27 * (long)(iVar32 / iVar33) +
                                        (this->AT_data).cstep * local_188 * sVar27),
                                 (Mat *)((long)local_158.data +
                                        (long)local_158.w *
                                        CONCAT44(local_158.elemsize._4_4_,
                                                 (undefined4)local_158.elemsize) *
                                        (long)(iVar32 / iVar33) +
                                        local_158.cstep * local_a8 *
                                        CONCAT44(local_158.elemsize._4_4_,
                                                 (undefined4)local_158.elemsize)),local_160,pMVar15,
                                 this_00,uVar31,(int)local_180,iVar8,iVar11,iVar30,iVar32,
                                 (int)pMVar24,(int)uVar25 <= iVar14 && bVar29);
                      iVar32 = iVar14;
                    } while (iVar14 < (int)uVar25);
                  }
                  pMVar24 = local_180;
                  if ((int)local_1e8 != 0) {
                    transpose_unpack_output_tile(pMVar15,this_00,(int)local_180,iVar8,iVar11,iVar30)
                    ;
                  }
                  iVar11 = iVar11 + (int)local_1e0;
                  uVar12 = local_168;
                  uVar18 = local_1e0;
                } while (iVar11 < (int)local_168);
              }
              uVar13 = local_188 + 1;
            } while (uVar13 != local_a0);
          }
          iVar8 = 0;
        }
        piVar19 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
        if (piVar19 != (int *)0x0) {
          LOCK();
          *piVar19 = *piVar19 + -1;
          UNLOCK();
          if (*piVar19 == 0) {
            if (local_f8.allocator == (Allocator *)0x0) {
              if ((Mat *)local_f8.data != (Mat *)0x0) {
                free(local_f8.data);
              }
            }
            else {
              (*(local_f8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      piVar19 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
      iVar11 = (int)local_90;
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 != 0) goto LAB_0047d274;
        if (local_158.allocator != (Allocator *)0x0) {
          (*(local_158.allocator)->_vptr_Allocator[3])();
          goto LAB_0047d274;
        }
joined_r0x0047c9a1:
        if (local_158.data != (void *)0x0) goto LAB_0047d26c;
      }
    }
  }
  else {
    iVar30 = (this->super_Gemm).constantM;
    iVar32 = (this->super_Gemm).constantN;
    iVar33 = (this->super_Gemm).constantK;
    local_1e0 = CONCAT44(local_1e0._4_4_,(this->super_Gemm).output_transpose);
    get_optimal_tile_mnk
              (iVar30,iVar32,iVar33,(this->super_Gemm).constant_TILE_M,
               (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,&TILE_M_2,
               &TILE_M,&TILE_N,iVar11);
    local_1e8 = (ulong)_TILE_M_2 & 0xffffffff;
    uVar18 = (long)(iVar30 + TILE_M_2 + -1) / (long)TILE_M_2;
    local_158.cstep = 0;
    local_158.data = (void *)0x0;
    local_158.refcount._0_4_ = 0;
    local_158.refcount._4_4_ = 0;
    local_158.elemsize._0_4_ = 0;
    local_158.elemsize._4_4_ = 0;
    local_158.elempack = 0;
    local_158.allocator = (Allocator *)0x0;
    local_158.dims = 0;
    local_158.w = 0;
    local_158.h = 0;
    local_158.d = 0;
    local_158.c = 0;
    local_108 = CONCAT71(local_108._1_7_,(int)local_1e0 != 0 || (uVar31 == 3 || TILE_N < iVar33));
    if ((int)local_1e0 != 0 || (uVar31 == 3 || TILE_N < iVar33)) {
      Mat::create(&local_158,TILE_M * TILE_M_2,1,iVar11,4,opt->workspace_allocator);
      iVar8 = -100;
      if ((local_158.data != (void *)0x0) && ((long)local_158.c * local_158.cstep != 0))
      goto LAB_0047bdbf;
    }
    else {
LAB_0047bdbf:
      if (0 < (int)uVar18) {
        local_180 = (Mat *)CONCAT71(local_180._1_7_,(int)local_1e0 == 0);
        uVar12 = 0;
        local_168 = CONCAT44(local_168._4_4_,iVar32);
        local_a8 = CONCAT44(local_a8._4_4_,TILE_M);
        iVar8 = TILE_M;
        local_170 = uVar18 & 0xffffffff;
        do {
          iVar11 = (int)local_1e8 * (int)uVar12;
          uVar18 = (ulong)(uint)(iVar30 - iVar11);
          if ((int)local_1e8 < iVar30 - iVar11) {
            uVar18 = local_1e8 & 0xffffffff;
          }
          local_f8.cstep = 0;
          local_f8.data = (Mat *)0x0;
          local_f8.refcount._0_4_ = 0;
          local_f8.refcount._4_4_ = 0;
          local_f8.elemsize._0_4_ = 0;
          local_f8.elemsize._4_4_ = 0;
          local_f8.elempack = 0;
          local_f8.h = 0;
          local_f8.d = 0;
          local_f8.c = 0;
          local_f8.allocator = (Allocator *)0x0;
          local_f8.dims = 0;
          local_f8.w = 0;
          if ((char)local_108 != '\0') {
            iVar14 = get_omp_thread_num();
            uVar13 = CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
            local_f8.cstep =
                 ((long)local_158.w * (long)local_158.h * uVar13 + 0xf & 0xfffffffffffffff0) /
                 uVar13;
            if (local_158.dims == 4) {
              local_f8.cstep = (long)local_158.w * (long)local_158.h;
            }
            local_f8.dims = local_158.dims + -1;
            local_f8.data = (void *)((long)iVar14 * uVar13 * local_158.cstep + (long)local_158.data)
            ;
            local_f8.elemsize._0_4_ = (undefined4)local_158.elemsize;
            local_f8.elemsize._4_4_ = local_158.elemsize._4_4_;
            local_f8.elempack = local_158.elempack;
            local_f8.allocator = local_158.allocator;
            local_f8.w = local_158.w;
            local_f8.h = local_158.h;
            local_f8.c = local_158.d;
            local_f8.d = 1;
          }
          local_f8.refcount._4_4_ = 0;
          local_f8.refcount._0_4_ = 0;
          if (0 < iVar32) {
            iVar14 = 0;
            local_188 = uVar18;
            local_160 = (Mat *)local_f8.data;
            do {
              iVar10 = iVar32 - iVar14;
              if (iVar8 < iVar32 - iVar14) {
                iVar10 = iVar8;
              }
              pMVar24 = &local_1d8;
              if (uVar31 == 3) {
                pack_A_tile(&local_1d8,local_160,iVar11,(int)uVar18,iVar14,iVar10);
                pMVar24 = &local_f8;
              }
              pMVar15 = local_160;
              if (0 < iVar33) {
                local_178 = (Mat *)(long)(iVar14 / (int)local_a8);
                iVar8 = iVar33;
                iVar32 = 0;
                do {
                  iVar17 = iVar8;
                  if (TILE_N < iVar8) {
                    iVar17 = TILE_N;
                  }
                  iVar8 = -(TILE_N - iVar8);
                  sVar27 = (this->AT_data).elemsize;
                  sVar2 = (this->BT_data).elemsize;
                  iVar22 = iVar32 + TILE_N;
                  gemm_transB_packed_tile
                            ((Mat *)((long)(this->AT_data).data +
                                    (long)(this->AT_data).w * sVar27 * (long)(iVar32 / TILE_N) +
                                    (this->AT_data).cstep * uVar12 * sVar27),
                             (Mat *)((long)(this->BT_data).data +
                                    (long)(this->BT_data).w * sVar2 * (long)(iVar32 / TILE_N) +
                                    (this->BT_data).cstep * (long)local_178 * sVar2),pMVar24,pMVar15
                             ,this_00,uVar31,iVar11,(int)local_188,iVar14,iVar10,iVar32,iVar17,
                             (bool)(iVar33 <= iVar22 & (byte)local_180));
                  iVar32 = iVar22;
                } while (iVar22 < iVar33);
              }
              uVar18 = local_188;
              if ((int)local_1e0 != 0) {
                transpose_unpack_output_tile(local_160,this_00,iVar11,(int)local_188,iVar14,iVar10);
              }
              iVar14 = iVar14 + (int)local_a8;
              iVar32 = (int)local_168;
              iVar8 = (int)local_a8;
            } while (iVar14 < (int)local_168);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != local_170);
      }
      iVar8 = 0;
    }
    piVar19 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
    iVar11 = (int)local_90;
    if (piVar19 != (int *)0x0) {
      LOCK();
      *piVar19 = *piVar19 + -1;
      UNLOCK();
      if (*piVar19 == 0) {
        if (local_158.allocator == (Allocator *)0x0) goto joined_r0x0047c9a1;
        (*(local_158.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_0047d274:
  if (((iVar8 == 0) && (iVar8 = 0, (this->super_Gemm).alpha != 1.0)) &&
     (uVar9 = iVar11 * (int)this_00->cstep * this_00->c, 0 < (int)uVar9)) {
    pvVar3 = this_00->data;
    iVar8 = 0;
    uVar18 = 0;
    do {
      *(float *)((long)pvVar3 + uVar18 * 4) =
           *(float *)((long)pvVar3 + uVar18 * 4) * (this->super_Gemm).alpha;
      uVar18 = uVar18 + 1;
    } while (uVar9 != uVar18);
  }
LAB_0047d279:
  piVar19 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
  if (piVar19 != (int *)0x0) {
    LOCK();
    *piVar19 = *piVar19 + -1;
    UNLOCK();
    if (*piVar19 == 0) {
      if (local_1d8.allocator == (Allocator *)0x0) {
        if (local_1d8.data != (void *)0x0) {
          free(local_1d8.data);
        }
      }
      else {
        (*(local_1d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar8;
}

Assistant:

int Gemm_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if NCNN_INT8
    if (int8_scale_term)
    {
        // return Gemm::forward_int8(bottom_blobs, top_blobs, opt);
        return forward_int8(bottom_blobs, top_blobs, opt);
    }
#endif

    int M;
    int N;
    if (constantA && constantB)
    {
        M = constantM;
        N = constantN;
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        M = constantM;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = constantN;
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }

    Mat C;
    int broadcast_type_C = 0;
    if (constantC)
    {
        C = CT_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB)
        {
            C = bottom_blobs.size() == 1 ? bottom_blobs[0] : Mat();
        }
        else if (constantA)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else if (constantB)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else
        {
            C = bottom_blobs.size() == 3 ? bottom_blobs[2] : Mat();
        }

        if (!C.empty())
        {
            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w * C.elempack == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w * C.elempack == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h * C.elempack == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }

            // pre-multiply C with beta
            if (beta != 1.f)
            {
                Mat C2;
                C2.create_like(C, opt.workspace_allocator);

                const int size = C.total() * C.elempack;
                for (int i = 0; i < size; i++)
                {
                    C2[i] = C[i] * beta;
                }

                C = C2;
            }
        }
    }

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        int outh = output_transpose ? N : M;
#if __AVX512F__
        out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
        out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    if (output_elempack)
        out_elempack = output_elempack;
    size_t out_elemsize = 4u * out_elempack;

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(M, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(N, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int _nT = nT ? nT : opt.num_threads;
    if (nT != 0 && opt.num_threads != nT)
    {
        // force num_threads the same as in create_pipeline
        // so we could use pre-packed A/B from the same tile config
        NCNN_LOGE("opt.num_threads %d changed, gemm will use load-time value %d", opt.num_threads, nT);
    }

    int ret = 0;
    if (constantA && constantB)
    {
        ret = gemm_AT_BT_x86(AT_data, BT_data, C, top_blob, broadcast_type_C, constantM, constantN, constantK, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        ret = gemm_AT_x86(AT_data, B, C, top_blob, broadcast_type_C, constantM, constantK, transB, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        ret = gemm_BT_x86(A, BT_data, C, top_blob, broadcast_type_C, constantN, constantK, transA, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        ret = gemm_x86(A, B, C, top_blob, broadcast_type_C, transA, transB, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    if (ret != 0)
        return ret;

    // multiply top_blob with alpha
    if (alpha != 1.f)
    {
        const int size = top_blob.total() * out_elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
        {
            top_blob[i] *= alpha;
        }
    }

    return 0;
}